

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::createMessageFromCommand(helics *this,ActionMessage *cmd)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  baseType *__s;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  __s = (baseType *)operator_new(0x100);
  memset(__s,0,0x100);
  __s[0xb] = 0x40;
  __s[0xc] = (baseType)(__s + 2);
  __s[0xd] = 0;
  __s[0xe] = (baseType)(__s + 0x10);
  __s[0xf] = 0;
  *(undefined1 *)(__s + 0x10) = 0;
  __s[0x12] = (baseType)(__s + 0x14);
  __s[0x13] = 0;
  *(undefined1 *)(__s + 0x14) = 0;
  __s[0x16] = (baseType)(__s + 0x18);
  __s[0x17] = 0;
  *(undefined1 *)(__s + 0x18) = 0;
  __s[0x1a] = (baseType)(__s + 0x1c);
  __s[0x1b] = 0;
  *(undefined1 *)(__s + 0x1c) = 0;
  *(undefined4 *)(__s + 0x1e) = 0;
  __s[0x1f] = 0;
  *(baseType **)this = __s;
  __str = (cmd->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(cmd->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__str >> 5;
  if (lVar1 != 0) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__s + 0xe);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__s + 0x12);
    if (lVar1 == 3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_01,__str);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(cmd->stringData).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      __str = (cmd->stringData).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__s + 0x16);
    }
    else if (lVar1 == 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_01,__str);
      __str = (cmd->stringData).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
      this_01 = this_00;
    }
    else if (lVar1 != 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_01,__str);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(cmd->stringData).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__s + 0x16),
                (cmd->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2);
      __str = (cmd->stringData).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3;
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__s + 0x1a);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,__str);
  }
  SmallBuffer::operator=((SmallBuffer *)(__s + 2),&cmd->payload);
  *__s = (cmd->actionTime).internalTimeCode;
  *(uint16_t *)(__s + 1) = cmd->flags;
  *(int32_t *)((long)__s + 0xc) = cmd->messageID;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> createMessageFromCommand(ActionMessage&& cmd)
{
    auto msg = std::make_unique<Message>();
    switch (cmd.stringData.size()) {
        case 0:
            break;
        case 1:
            msg->dest = std::move(cmd.stringData[0]);
            break;
        case 2:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            break;
        case 3:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            break;
        default:
            msg->dest = std::move(cmd.stringData[0]);
            msg->source = std::move(cmd.stringData[1]);
            msg->original_source = std::move(cmd.stringData[2]);
            msg->original_dest = std::move(cmd.stringData[3]);
            break;
    }
    msg->data = std::move(cmd.payload);
    msg->time = cmd.actionTime;
    msg->flags = cmd.flags;
    msg->messageID = cmd.messageID;
    return msg;
}